

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::AddRuleHash
          (cmGlobalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,string *content)

{
  cmState *this_00;
  string *psVar1;
  mapped_type *pmVar2;
  string fname;
  RuleHash hash;
  cmStateDirectory cmDir;
  undefined1 local_88 [32];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined1 local_48 [40];
  
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    cmCryptoHash::cmCryptoHash((cmCryptoHash *)local_88,AlgoMD5);
    cmCryptoHash::HashString((string *)local_48,(cmCryptoHash *)local_88,content);
    local_68 = *(undefined8 *)local_48._0_8_;
    uStack_60 = *(undefined8 *)(local_48._0_8_ + 8);
    local_58 = *(undefined8 *)(local_48._0_8_ + 0x10);
    uStack_50 = *(undefined8 *)(local_48._0_8_ + 0x18);
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    cmCryptoHash::~cmCryptoHash((cmCryptoHash *)local_88);
    cmMakefile::GetStateSnapshot
              (*(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                _M_impl.super__Vector_impl_data._M_start);
    cmStateSnapshot::GetDirectory((cmStateDirectory *)local_48,(cmStateSnapshot *)local_88);
    this_00 = cmMakefile::GetState
                        (*(this->Makefiles).
                          super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
    psVar1 = cmState::GetBinaryDirectory_abi_cxx11_(this_00);
    cmStateDirectory::ConvertToRelPathIfNotContained
              ((string *)local_88,(cmStateDirectory *)local_48,psVar1,
               (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalGenerator::RuleHash>_>_>
             ::operator[](&this->RuleHashes,(key_type *)local_88);
    *(undefined8 *)(pmVar2->Data + 0x10) = local_58;
    *(undefined8 *)(pmVar2->Data + 0x18) = uStack_50;
    *(undefined8 *)pmVar2->Data = local_68;
    *(undefined8 *)(pmVar2->Data + 8) = uStack_60;
    if ((cmState *)local_88._0_8_ != (cmState *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
  }
  return;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}